

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheVk::SetDynamicBufferOffset
          (ShaderResourceCacheVk *this,Uint32 DescrSetIndex,Uint32 CacheOffset,
          Uint32 DynamicBufferOffset)

{
  DescriptorSet *this_00;
  Resource *pRVar1;
  BufferVkImpl *pBVar2;
  BufferViewVkImpl *this_01;
  string msg;
  string local_40;
  
  this_00 = GetDescriptorSet(this,DescrSetIndex);
  pRVar1 = DescriptorSet::GetResource(this_00,CacheOffset);
  if ((0xc < pRVar1->Type) || ((0x1900U >> (pRVar1->Type & 0x1f) & 1) == 0)) {
    FormatString<char[70]>
              (&local_40,
               (char (*) [70])
               "Dynamic offsets can only be set of dynamic uniform or storage buffers");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x1a8);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((pRVar1->pObject).m_pObject == (IDeviceObject *)0x0) {
    FormatString<char[47]>
              (&local_40,(char (*) [47])"Setting dynamic offset when no object is bound");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x1aa);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (pRVar1->Type == UniformBufferDynamic) {
    pBVar2 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferVkImpl>
                       (&pRVar1->pObject);
  }
  else {
    this_01 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                        (&pRVar1->pObject);
    pBVar2 = BufferViewBase<Diligent::EngineVkImplTraits>::GetBuffer<Diligent::BufferVkImpl_const>
                       (&this_01->super_BufferViewBase<Diligent::EngineVkImplTraits>);
  }
  if ((pBVar2->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Size < (ulong)DynamicBufferOffset + pRVar1->BufferBaseOffset + pRVar1->BufferRangeSize
     ) {
    FormatString<char[41]>(&local_40,(char (*) [41])"Specified offset is out of buffer bounds");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x1af);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pRVar1->BufferDynamicOffset = DynamicBufferOffset;
  return;
}

Assistant:

void ShaderResourceCacheVk::SetDynamicBufferOffset(Uint32 DescrSetIndex,
                                                   Uint32 CacheOffset,
                                                   Uint32 DynamicBufferOffset)
{
    DescriptorSet& DescrSet = GetDescriptorSet(DescrSetIndex);
    Resource&      DstRes   = DescrSet.GetResource(CacheOffset);
    VERIFY(IsDynamicDescriptorType(DstRes.Type), "Dynamic offsets can only be set of dynamic uniform or storage buffers");

    DEV_CHECK_ERR(DstRes.pObject, "Setting dynamic offset when no object is bound");
    const BufferVkImpl* pBufferVk = DstRes.Type == DescriptorType::UniformBufferDynamic ?
        DstRes.pObject.ConstPtr<BufferVkImpl>() :
        DstRes.pObject.ConstPtr<BufferViewVkImpl>()->GetBuffer<const BufferVkImpl>();
    DEV_CHECK_ERR(DstRes.BufferBaseOffset + DstRes.BufferRangeSize + DynamicBufferOffset <= pBufferVk->GetDesc().Size,
                  "Specified offset is out of buffer bounds");

    DstRes.BufferDynamicOffset = DynamicBufferOffset;
}